

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglClientExtensionTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::anon_unknown_0::BaseTest::iterate(BaseTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 errCode;
  Library *pLVar2;
  undefined4 extraout_var;
  size_t sVar3;
  istream *piVar4;
  TestError *this_01;
  char *pcVar5;
  qpTestResult testResult;
  pointer_____offset_0x10___ *ppuVar6;
  string extension;
  istringstream stream;
  undefined1 *local_350;
  undefined8 local_348;
  undefined1 local_340;
  undefined7 uStack_33f;
  undefined1 local_330 [16];
  TestLog local_320 [13];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  iVar1 = (*pLVar2->_vptr_Library[0x2a])(pLVar2,0,0x3055);
  pcVar5 = (char *)CONCAT44(extraout_var,iVar1);
  errCode = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  if (errCode == 0x3000) {
    if (pcVar5 != (char *)0x0) {
      local_330._0_8_ = local_320;
      sVar3 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_330,pcVar5,pcVar5 + sVar3);
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_330,_S_in);
      if ((TestLog *)local_330._0_8_ != local_320) {
        operator_delete((void *)local_330._0_8_,(ulong)((long)&(local_320[0].m_log)->flags + 1));
      }
      local_348 = 0;
      local_340 = 0;
      local_350 = &local_340;
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b0,(string *)&local_350,' ');
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
          local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          this_00 = (ostringstream *)(local_330 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,
                     "eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS) didn\'t fail, but extension string doesn\'t contain EGL_EXT_client_extensions"
                     ,0x7a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_2b8);
          pcVar5 = "Fail";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_00e2d8be;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_350);
      } while (iVar1 != 0);
      pcVar5 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_00e2d8be:
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar5);
      if (local_350 != &local_340) {
        operator_delete(local_350,CONCAT71(uStack_33f,local_340) + 1);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      return STOP;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"clientExtesionsStr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
               ,0x91);
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  else if (errCode == 0x3008) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"EGL_EXT_client_extensions not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
               ,0x8d);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    eglu::Error::Error((Error *)this_01,errCode,"eglQueryString()",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
                       ,0x8f);
    ppuVar6 = &eglu::Error::typeinfo;
  }
  __cxa_throw(this_01,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

TestCase::IterateResult BaseTest::iterate (void)
{
	const Library&		egl					= m_eglTestCtx.getLibrary();
	const char* const	clientExtesionsStr	= egl.queryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
	const EGLint		eglError			= egl.getError();

	if (eglError == EGL_BAD_DISPLAY)
		TCU_THROW(NotSupportedError, "EGL_EXT_client_extensions not supported");
	else if (eglError != EGL_SUCCESS)
		throw eglu::Error(eglError, "eglQueryString()", DE_NULL, __FILE__, __LINE__);

	TCU_CHECK(clientExtesionsStr);

	{
		bool				found		= false;
		std::istringstream	stream		(clientExtesionsStr);
		string				extension;

		while (std::getline(stream, extension, ' '))
		{
			if (extension == "EGL_EXT_client_extensions")
			{
				found = true;
				break;
			}
		}

		if (found)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
		{
			m_testCtx.getLog() << TestLog::Message << "eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS) didn't fail, but extension string doesn't contain EGL_EXT_client_extensions" <<TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}